

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qframe.cpp
# Opt level: O1

bool __thiscall QFrame::event(QFrame *this,QEvent *e)

{
  bool bVar1;
  
  if (*(short *)(e + 8) == 0x15) {
    QFramePrivate::updateFrameWidth(*(QFramePrivate **)&(this->super_QWidget).field_0x8);
  }
  bVar1 = QWidget::event(&this->super_QWidget,e);
  if (*(short *)(e + 8) == 0x4b) {
    QFramePrivate::updateFrameWidth(*(QFramePrivate **)&(this->super_QWidget).field_0x8);
  }
  return bVar1;
}

Assistant:

bool QFrame::event(QEvent *e)
{
    if (e->type() == QEvent::ParentChange)
        d_func()->updateFrameWidth();
    bool result = QWidget::event(e);
    //this has to be done after the widget has been polished
    if (e->type() == QEvent::Polish)
        d_func()->updateFrameWidth();
    return result;
}